

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferObjectQueryTests.cpp
# Opt level: O0

void deqp::gles3::Functional::BufferParamVerifiers::checkIntEquals
               (TestContext *testCtx,GLint got,GLint expected)

{
  qpTestResult qVar1;
  TestLog *this;
  MessageBuilder *pMVar2;
  MessageBuilder local_198;
  GLint local_18;
  GLint local_14;
  GLint expected_local;
  GLint got_local;
  TestContext *testCtx_local;
  
  if (got != expected) {
    local_18 = expected;
    local_14 = got;
    _expected_local = testCtx;
    this = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_198,this,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [20])"// ERROR: Expected ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_18);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [7])0x12a3d6f);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_14);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_198);
    qVar1 = tcu::TestContext::getTestResult(_expected_local);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(_expected_local,QP_TEST_RESULT_FAIL,"got invalid value");
    }
  }
  return;
}

Assistant:

void checkIntEquals (tcu::TestContext& testCtx, GLint got, GLint expected)
{
	using tcu::TestLog;

	if (got != expected)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: Expected " << expected << "; got " << got << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid value");
	}
}